

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O1

bool Imf_3_2::anon_unknown_0::readDeepTile<Imf_3_2::DeepTiledInputFile>
               (DeepTiledInputFile *in,bool reduceMemory,bool reduceTime)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  bool bVar6;
  Array2D<float_*> *pAVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Header *pHVar16;
  uint *puVar17;
  long lVar18;
  char *pcVar19;
  _Rb_tree_node_base *p_Var20;
  _Rb_tree_node_base *p_Var21;
  void *pvVar22;
  ulong uVar23;
  long lVar24;
  char *pcVar25;
  int iVar26;
  long size;
  size_type __new_size;
  long lVar27;
  int iVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  Array<Imf_3_2::Array2D<float_*>_> data;
  vector<float,_std::allocator<float>_> pixelBuffer;
  DeepFrameBuffer frameBuffer;
  
  Imf_3_2::DeepTiledInputFile::header();
  pHVar16 = (Header *)Imf_3_2::DeepTiledInputFile::header();
  iVar9 = Imf_3_2::calculateBytesPerPixel(pHVar16);
  Imf_3_2::DeepTiledInputFile::header();
  puVar17 = (uint *)Imf_3_2::Header::tileDescription();
  uVar2 = *puVar17;
  lVar35 = (long)(int)uVar2;
  uVar3 = puVar17[1];
  lVar18 = (long)(int)uVar3;
  iVar10 = Imf_3_2::DeepTiledInputFile::numYLevels();
  iVar11 = Imf_3_2::DeepTiledInputFile::numXLevels();
  uVar23 = lVar18 * lVar35;
  pcVar19 = (char *)operator_new__(-(ulong)(uVar23 >> 0x3e != 0) | uVar23 * 4);
  Imf_3_2::Header::channels();
  p_Var20 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  size = 0;
  while( true ) {
    Imf_3_2::Header::channels();
    p_Var21 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var20 == p_Var21) break;
    p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
    size = size + 1;
  }
  Array<Imf_3_2::Array2D<float_*>_>::Array(&data,size);
  iVar26 = (int)size;
  if (iVar26 != 0) {
    lVar36 = 0x10;
    lVar24 = size;
    do {
      pAVar7 = data._data;
      pvVar22 = operator_new__(-(ulong)(uVar23 >> 0x3d != 0) | uVar23 * 8);
      pvVar5 = *(void **)((long)&pAVar7->_sizeX + lVar36);
      if (pvVar5 != (void *)0x0) {
        operator_delete__(pvVar5);
      }
      *(long *)((long)pAVar7 + lVar36 + -0x10) = lVar18;
      *(long *)((long)pAVar7 + lVar36 + -8) = lVar35;
      *(void **)((long)&pAVar7->_sizeX + lVar36) = pvVar22;
      lVar36 = lVar36 + 0x18;
      lVar24 = lVar24 + -1;
    } while (lVar24 != 0);
  }
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  Imf_3_2::Slice::Slice((Slice *)&pixelBuffer,UINT,pcVar19,4,lVar35 * 4,1,1,0.0,true,true);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  Imf_3_2::Header::channels();
  p_Var20 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  lVar24 = 0x10;
  while( true ) {
    Imf_3_2::Header::channels();
    p_Var21 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var20 == p_Var21) break;
    Imf_3_2::DeepSlice::DeepSlice
              ((DeepSlice *)&pixelBuffer,FLOAT,*(char **)((long)&(data._data)->_sizeX + lVar24),8,
               lVar35 * 8,4,1,1,0.0,true,true);
    Imf_3_2::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)(p_Var20 + 1));
    p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
    lVar24 = lVar24 + 0x18;
  }
  Imf_3_2::DeepTiledInputFile::setFrameBuffer((DeepFrameBuffer *)in);
  pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar15 = 0;
  bVar6 = 0 < iVar10;
  if (0 < iVar10) {
    do {
      bVar8 = 0 < iVar11;
      if (0 < iVar11) {
        iVar34 = 0;
        do {
          iVar28 = 0;
          do {
            iVar12 = iVar28;
            iVar28 = (int)in;
            iVar13 = Imf_3_2::DeepTiledInputFile::numYTiles(iVar28);
            if (iVar13 <= iVar12) break;
            for (iVar1 = 0; iVar14 = Imf_3_2::DeepTiledInputFile::numXTiles(iVar28), iVar1 < iVar14;
                iVar1 = iVar1 + 1) {
              Imf_3_2::DeepTiledInputFile::readPixelSampleCounts
                        (iVar28,iVar1,iVar12,iVar1,iVar12,iVar34);
              if ((int)uVar3 < 1) {
                __new_size = 0;
                lVar24 = 0;
              }
              else {
                lVar36 = 0;
                lVar24 = 0;
                __new_size = 0;
                pcVar25 = pcVar19;
                do {
                  if (0 < (int)uVar2) {
                    uVar23 = 0;
                    do {
                      uVar31 = (ulong)(uint)(iVar26 * *(int *)(pcVar25 + uVar23 * 4));
                      lVar24 = lVar24 + uVar31;
                      uVar29 = 0;
                      if ((uint)(*(int *)(pcVar25 + uVar23 * 4) * iVar9) < 0x1000) {
                        uVar29 = uVar31;
                      }
                      if (!reduceMemory) {
                        uVar29 = uVar31;
                      }
                      __new_size = __new_size + uVar29;
                      uVar23 = uVar23 + 1;
                    } while (uVar2 != uVar23);
                  }
                  lVar36 = lVar36 + 1;
                  pcVar25 = pcVar25 + lVar35 * 4;
                } while (lVar36 != lVar18);
              }
              if ((__new_size != 0) &&
                 ((!reduceMemory || ((lVar24 + __new_size) * (long)iVar9 < 1000)))) {
                std::vector<float,_std::allocator<float>_>::resize(&pixelBuffer,__new_size);
                if (0 < (int)uVar3) {
                  lVar24 = 0;
                  lVar36 = 0;
                  do {
                    if (0 < (int)uVar2) {
                      lVar27 = 0;
                      do {
                        if ((reduceMemory) &&
                           (999 < (uint)(*(int *)(pcVar19 + lVar27 * 4 + lVar24 * lVar35 * 4) *
                                        iVar9))) {
                          if (iVar26 != 0) {
                            lVar33 = 0x10;
                            lVar30 = size;
                            do {
                              *(undefined8 *)
                               (*(long *)((long)data._data + lVar33 + -8) * lVar24 * 8 +
                                *(long *)((long)&(data._data)->_sizeX + lVar33) + lVar27 * 8) = 0;
                              lVar33 = lVar33 + 0x18;
                              lVar30 = lVar30 + -1;
                            } while (lVar30 != 0);
                          }
                        }
                        else if (iVar26 != 0) {
                          uVar4 = *(uint *)(pcVar19 + lVar27 * 4 + lVar24 * lVar35 * 4);
                          lVar30 = lVar36 * 4;
                          lVar36 = lVar36 + size * (ulong)uVar4;
                          lVar32 = 4;
                          lVar33 = size;
                          do {
                            *(long *)(*(long *)((long)data._data + lVar32 * 4 + -8) * lVar24 * 8 +
                                      *(long *)((long)&(data._data)->_sizeX + lVar32 * 4) +
                                     lVar27 * 8) =
                                 (long)pixelBuffer.super__Vector_base<float,_std::allocator<float>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar30;
                            lVar32 = lVar32 + 6;
                            lVar30 = lVar30 + (ulong)uVar4 * 4;
                            lVar33 = lVar33 + -1;
                          } while (lVar33 != 0);
                        }
                        lVar27 = lVar27 + 1;
                      } while (lVar27 != lVar35);
                    }
                    lVar24 = lVar24 + 1;
                  } while (lVar24 != lVar18);
                }
                Imf_3_2::DeepTiledInputFile::readTile(iVar28,iVar1,iVar12,iVar34);
              }
            }
            iVar28 = iVar12 + 1;
          } while (iVar14 <= iVar1);
          if (iVar12 < iVar13) break;
          iVar34 = iVar34 + 1;
          bVar8 = iVar34 < iVar11;
        } while (iVar34 != iVar11);
      }
      if (bVar8) break;
      iVar15 = iVar15 + 1;
      bVar6 = iVar15 < iVar10;
    } while (iVar15 != iVar10);
  }
  if (pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&frameBuffer);
  Array<Imf_3_2::Array2D<float_*>_>::~Array(&data);
  operator_delete__(pcVar19);
  return bVar6;
}

Assistant:

bool
readDeepTile (T& in, bool reduceMemory, bool reduceTime)
{
    bool threw = false;
    try
    {
        const Header& fileHeader = in.header ();

        Array2D<unsigned int> localSampleCount;

        int      bytesPerSample = calculateBytesPerPixel (in.header ());

        const TileDescription& td         = in.header ().tileDescription ();
        int                    tileWidth  = td.xSize;
        int                    tileHeight = td.ySize;
        int                    numYLevels = in.numYLevels ();
        int                    numXLevels = in.numXLevels ();

        localSampleCount.resizeErase (tileHeight, tileWidth);

        int channelCount = 0;
        for (ChannelList::ConstIterator i = fileHeader.channels ().begin ();
             i != fileHeader.channels ().end ();
             ++i, channelCount++)
            ;

        Array<Array2D<float*>> data (channelCount);

        for (int i = 0; i < channelCount; i++)
        {
            data[i].resizeErase (tileHeight, tileWidth);
        }

        DeepFrameBuffer frameBuffer;

        //
        // Use integer arithmetic instead of pointer arithmetic to compute offset into array.
        // if memOffset is larger than base, then the computed pointer is negative, which is reported as undefined behavior
        // Instead, integers are used for computation which behaves as expected an all known architectures
        //

        frameBuffer.insertSampleCountSlice (Slice (
            UINT,
            reinterpret_cast<char*> (&localSampleCount[0][0]),
            sizeof (unsigned int) * 1,
            sizeof (unsigned int) * tileWidth,
            1,
            1,    // x/ysampling
            0.0,  // fill
            true, // relative x
            true  // relative y
            ));

        int channel = 0;
        for (ChannelList::ConstIterator i = fileHeader.channels ().begin ();
             i != fileHeader.channels ().end ();
             ++i, ++channel)
        {
            int sampleSize = sizeof (float);

            int pointerSize = sizeof (char*);

            frameBuffer.insert (
                i.name (),
                DeepSlice (
                    FLOAT,
                    reinterpret_cast<char*> (&data[channel][0][0]),
                    pointerSize * 1,
                    pointerSize * tileWidth,
                    sampleSize,
                    1,
                    1,
                    0.0,
                    true,
                    true));
        }

        in.setFrameBuffer (frameBuffer);
        size_t step = 1;

        int  tileIndex = 0;
        bool isRipMap  = td.mode == RIPMAP_LEVELS;

        vector<float> pixelBuffer;

        //
        // read all tiles from all levels.
        //
        for (int ylevel = 0; ylevel < numYLevels; ++ylevel)
        {
            for (int xlevel = 0; xlevel < numXLevels; ++xlevel)
            {
                for (int y = 0; y < in.numYTiles (ylevel); ++y)
                {
                    for (int x = 0; x < in.numXTiles (xlevel); ++x)
                    {
                        if (tileIndex % step == 0)
                        {
                            try
                            {

                                in.readPixelSampleCounts (
                                    x, y, x, y, xlevel, ylevel);

                                size_t bufferSize = 0;
                                size_t fileBufferSize = 0;

                                for (int ty = 0; ty < tileHeight; ++ty)
                                {
                                    for (int tx = 0; tx < tileWidth; ++tx)
                                    {
                                        fileBufferSize += channelCount *
                                                localSampleCount[ty][tx];

                                        if (!reduceMemory ||
                                            localSampleCount[ty][tx] *
                                                    bytesPerSample <
                                                gMaxBytesPerDeepScanline)
                                        {
                                            bufferSize +=
                                                channelCount *
                                                localSampleCount[ty][tx];
                                        }
                                    }
                                }

                                // skip reading if no data to read, or limiting memory and tile is too large
                                if (bufferSize > 0 &&
                                    (!reduceMemory ||
                                     (fileBufferSize + bufferSize) * bytesPerSample <
                                         gMaxBytesPerDeepPixel))
                                {

                                    pixelBuffer.resize (bufferSize);
                                    size_t bufferIndex = 0;

                                    for (int ty = 0; ty < tileHeight; ++ty)
                                    {
                                        for (int tx = 0; tx < tileWidth; ++tx)
                                        {
                                            if (!reduceMemory ||
                                                localSampleCount[ty][tx] *
                                                        bytesPerSample <
                                                    gMaxBytesPerDeepPixel)
                                            {
                                                for (int k = 0;
                                                     k < channelCount;
                                                     ++k)
                                                {
                                                    data[k][ty][tx] =
                                                        &pixelBuffer
                                                            [bufferIndex];
                                                    bufferIndex +=
                                                        localSampleCount[ty]
                                                                        [tx];
                                                }
                                            }
                                            else
                                            {
                                                for (int k = 0;
                                                     k < channelCount;
                                                     ++k)
                                                {
                                                    data[k][ty][tx] = nullptr;
                                                }
                                            }
                                        }
                                    }

                                    in.readTile (x, y, xlevel, ylevel);
                                }
                            }

                            catch (...)
                            {
                                //
                                // for one level and mipmapped images,
                                // xlevel must match ylevel,
                                // otherwise an exception is thrown
                                // ignore that exception
                                //
                                if (isRipMap || xlevel == ylevel)
                                {
                                    threw = true;
                                    //
                                    // in reduceTime mode, fail immediately - the file is corrupt
                                    //
                                    if (reduceTime) { return threw; }
                                }
                            }
                        }
                        tileIndex++;
                    }
                }
            }
        }
    }
    catch (...)
    {
        threw = true;
    }
    return threw;
}